

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_true>::~VmBase
          (VmBase<defyx::AlignedAllocator<64UL>,_true> *this)

{
  undefined8 *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_00168520;
  AlignedAllocator<64UL>::freeMemory(in_stack_ffffffffffffffe8,0x127102);
  defyx_vm::~defyx_vm((defyx_vm *)0x12710e);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}